

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O3

int make_substreamsInfo(archive_write *a,coder *coders)

{
  void *pvVar1;
  uint uVar2;
  ssize_t sVar3;
  long *plVar4;
  long lVar5;
  uint8_t crc [4];
  undefined4 local_1c;
  
  pvVar1 = a->format_data;
  uVar2 = enc_uint64(a,8);
  if (-1 < (int)uVar2) {
    if ((*(ulong *)((long)pvVar1 + 0x20) < 2) || (coders->codec == 0)) {
LAB_00197647:
      uVar2 = enc_uint64(a,10);
      if ((-1 < (int)uVar2) && (uVar2 = enc_uint64(a,1), -1 < (int)uVar2)) {
        lVar5 = *(long *)((long)pvVar1 + 0xf110);
        if (lVar5 != 0) {
          do {
            if (*(long *)(lVar5 + 0x30) == 0) break;
            local_1c = *(undefined4 *)(lVar5 + 0x74);
            sVar3 = compress_out(a,&local_1c,4,ARCHIVE_Z_RUN);
            if ((int)sVar3 < 0) {
              return (int)sVar3;
            }
            lVar5 = *(long *)(lVar5 + 0x18);
          } while (lVar5 != 0);
        }
        uVar2 = enc_uint64(a,0);
        uVar2 = (int)uVar2 >> 0x1f & uVar2;
      }
    }
    else {
      uVar2 = enc_uint64(a,0xd);
      if ((-1 < (int)uVar2) &&
         ((uVar2 = enc_uint64(a,*(uint64_t *)((long)pvVar1 + 0x20)), -1 < (int)uVar2 &&
          (uVar2 = enc_uint64(a,9), -1 < (int)uVar2)))) {
        plVar4 = (long *)((long)pvVar1 + 0xf110);
        do {
          lVar5 = *plVar4;
          if (((lVar5 == 0) || (*(long *)(lVar5 + 0x18) == 0)) ||
             (*(long *)(*(long *)(lVar5 + 0x18) + 0x30) == 0)) goto LAB_00197647;
          plVar4 = (long *)(lVar5 + 0x18);
          uVar2 = enc_uint64(a,*(uint64_t *)(lVar5 + 0x30));
        } while (-1 < (int)uVar2);
      }
    }
  }
  return uVar2;
}

Assistant:

static int
make_substreamsInfo(struct archive_write *a, struct coder *coders)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	struct file *file;
	int r;

	/*
	 * Make SubStreamsInfo.
	 */
	r = enc_uint64(a, kSubStreamsInfo);
	if (r < 0)
		return (r);

	if (zip->total_number_nonempty_entry > 1 && coders->codec != _7Z_COPY) {
		/*
		 * Make NumUnPackStream.
		 */
		r = enc_uint64(a, kNumUnPackStream);
		if (r < 0)
			return (r);

		/* Write numUnpackStreams */
		r = enc_uint64(a, zip->total_number_nonempty_entry);
		if (r < 0)
			return (r);

		/*
		 * Make kSize.
		 */
		r = enc_uint64(a, kSize);
		if (r < 0)
			return (r);
		file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->next == NULL ||
			    file->next->size == 0)
				break;
			r = enc_uint64(a, file->size);
			if (r < 0)
				return (r);
		}
	}

	/*
	 * Make CRC.
	 */
	r = enc_uint64(a, kCRC);
	if (r < 0)
		return (r);


	/* All are defined */
	r = enc_uint64(a, 1);
	if (r < 0)
		return (r);
	file = zip->file_list.first;
	for (;file != NULL; file = file->next) {
		uint8_t crc[4];
		if (file->size == 0)
			break;
		archive_le32enc(crc, file->crc32);
		r = (int)compress_out(a, crc, 4, ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);
	return (ARCHIVE_OK);
}